

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.cpp
# Opt level: O0

CAmount __thiscall
wallet::SelectionResult::GetChange
          (SelectionResult *this,CAmount min_viable_change,CAmount change_fee)

{
  long lVar1;
  CAmount CVar2;
  SelectionResult *in_RDX;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  CAmount change;
  undefined8 local_40;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(byte *)(in_RDI + 0x39) & 1) == 0) {
    CVar2 = GetSelectedValue(in_RDX);
    local_40 = CVar2 - *(long *)(in_RDI + 0x30);
  }
  else {
    CVar2 = GetSelectedEffectiveValue(in_RDX);
    local_40 = (CVar2 - *(long *)(in_RDI + 0x30)) - (long)in_RDX;
  }
  if (local_40 < in_RSI) {
    local_10 = 0;
  }
  else {
    local_10 = local_40;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

CAmount SelectionResult::GetChange(const CAmount min_viable_change, const CAmount change_fee) const
{
    // change = SUM(inputs) - SUM(outputs) - fees
    // 1) With SFFO we don't pay any fees
    // 2) Otherwise we pay all the fees:
    //  - input fees are covered by GetSelectedEffectiveValue()
    //  - non_input_fee is included in m_target
    //  - change_fee
    const CAmount change = m_use_effective
                           ? GetSelectedEffectiveValue() - m_target - change_fee
                           : GetSelectedValue() - m_target;

    if (change < min_viable_change) {
        return 0;
    }

    return change;
}